

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getIisInterface(Highs *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  double *pdVar4;
  int *piVar5;
  size_type sVar6;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000090;
  bool in_stack_0000009f;
  double *in_stack_000000a0;
  double *in_stack_000000a8;
  double *in_stack_000000b0;
  double in_stack_000000b8;
  HighsInt iterations;
  double time;
  HighsInt iX;
  HighsInt max_iterations;
  HighsInt sum_iterations;
  HighsInt min_iterations;
  double max_time;
  double sum_time;
  double min_time;
  HighsInt num_lp_solved;
  HighsStatus return_status;
  HighsLp check_lp_after;
  HighsStatus return_status_1;
  HighsLp check_lp_before;
  vector<int,_std::allocator<int>_> infeasible_row_subset;
  bool has_dual_ray;
  HighsStatus run_status;
  HighsIisInfo iis_info;
  string presolve;
  bool ray_option;
  HighsInt num_row;
  HighsLp *lp;
  undefined4 in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff714;
  char *local_8e8;
  HighsLogOptions *in_stack_fffffffffffff720;
  HighsLogOptions *local_8c8;
  HighsOptions *in_stack_fffffffffffff788;
  HighsLp *in_stack_fffffffffffff790;
  HighsIis *in_stack_fffffffffffff798;
  HighsInt local_83c;
  double local_838;
  int local_830;
  int local_82c;
  int local_828;
  int local_824;
  double local_820;
  double local_818;
  double local_810;
  uint local_808;
  HighsStatus local_804;
  HighsStatus local_464;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc08;
  HighsBasis *in_stack_fffffffffffffc10;
  HighsOptions *in_stack_fffffffffffffc18;
  HighsLp *in_stack_fffffffffffffc20;
  HighsIis *in_stack_fffffffffffffc28;
  vector<int,_std::allocator<int>_> local_c8;
  undefined1 local_a9;
  uint local_68;
  undefined1 local_1d;
  int local_1c;
  long local_18;
  HighsStatus local_4;
  
  if ((*(byte *)(in_RDI + 0x11a8) & 1) == 0) {
    HighsIis::invalidate((HighsIis *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710));
    local_18 = in_RDI + 0x138;
    bVar1 = HighsIis::trivial(in_stack_fffffffffffff798,in_stack_fffffffffffff790,
                              in_stack_fffffffffffff788);
    if (bVar1) {
      local_4 = kOk;
    }
    else {
      local_1c = *(int *)(local_18 + 4);
      if (local_1c == 0) {
        *(undefined1 *)(in_RDI + 0x11a8) = 1;
        local_4 = kOk;
      }
      else {
        local_1d = 0;
        local_a9 = *(int *)(in_RDI + 0x4a40) != -1;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x4dfe5f);
        invalidateSolverData((Highs *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710))
        ;
        HighsLp::HighsLp(in_stack_fffffffffffff790,(HighsLp *)in_stack_fffffffffffff788);
        local_464 = elasticityFilter(_sum_iterations,_iX,time,in_stack_000000b8,in_stack_000000b0,
                                     in_stack_000000a8,in_stack_000000a0,in_stack_0000009f,
                                     in_stack_00000090);
        HighsLp::HighsLp(in_stack_fffffffffffff790,(HighsLp *)in_stack_fffffffffffff788);
        if (local_464 != kOk) {
          local_4 = local_464;
        }
        local_68 = (uint)(local_464 != kOk);
        HighsLp::~HighsLp((HighsLp *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710));
        HighsLp::~HighsLp((HighsLp *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710));
        if (local_68 == 0) {
          local_804 = kOk;
          sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_c8);
          if (sVar2 == 0) {
            *(undefined1 *)(in_RDI + 0x11a8) = 1;
          }
          else {
            local_804 = HighsIis::getData(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                                          in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                                          in_stack_fffffffffffffc08);
            if ((local_804 == kOk) &&
               ((sVar2 = std::vector<int,_std::allocator<int>_>::size
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11b0)),
                sVar2 != 0 ||
                (sVar2 = std::vector<int,_std::allocator<int>_>::size
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11c8)),
                sVar2 != 0)))) {
              *(undefined4 *)(in_RDI + 0x1244) = 8;
            }
            sVar2 = std::vector<HighsIisInfo,_std::allocator<HighsIisInfo>_>::size
                              ((vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)
                               (in_RDI + 0x1210));
            local_808 = (uint)sVar2;
            local_810 = INFINITY;
            local_818 = 0.0;
            local_820 = 0.0;
            local_824 = 0x7fffffff;
            local_828 = 0;
            local_82c = 0;
            for (local_830 = 0; local_830 < (int)local_808; local_830 = local_830 + 1) {
              pvVar3 = std::vector<HighsIisInfo,_std::allocator<HighsIisInfo>_>::operator[]
                                 ((vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)
                                  (in_RDI + 0x1210),(long)local_830);
              local_838 = pvVar3->simplex_time;
              pvVar3 = std::vector<HighsIisInfo,_std::allocator<HighsIisInfo>_>::operator[]
                                 ((vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)
                                  (in_RDI + 0x1210),(long)local_830);
              local_83c = pvVar3->simplex_iterations;
              pdVar4 = std::min<double>(&local_838,&local_810);
              local_810 = *pdVar4;
              local_818 = local_818 + local_838;
              pdVar4 = std::max<double>(&local_838,&local_820);
              local_820 = *pdVar4;
              piVar5 = std::min<int>(&local_83c,&local_824);
              local_824 = *piVar5;
              local_828 = local_828 + local_83c;
              piVar5 = std::max<int>(&local_83c,&local_82c);
              local_82c = *piVar5;
            }
            sVar2 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11b0));
            sVar6 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11c8));
            if ((int)local_808 < 1) {
              local_8c8 = (HighsLogOptions *)0x0;
              local_8e8 = (char *)0x0;
              in_stack_fffffffffffff720 = local_8c8;
            }
            else {
              in_stack_fffffffffffff720 =
                   (HighsLogOptions *)(((double)local_828 * 1.0) / (double)(int)local_808);
              local_8e8 = (char *)(local_818 / (double)(int)local_808);
            }
            highsLogUser(in_stack_fffffffffffff720,SUB84(local_810,0),local_8e8,local_820,
                         in_RDI + 0xe28,1,
                         " %d cols, %d rows, %d LPs solved (min / average / max) iteration count (%6d / %6.2g / % 6d) and time (%6.2f / %6.2f / % 6.2f) \n"
                         ,sVar2 & 0xffffffff,sVar6 & 0xffffffff,(ulong)local_808,local_824,local_82c
                        );
          }
          local_4 = local_804;
          local_68 = 1;
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff720);
      }
    }
  }
  else {
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getIisInterface() {
  if (this->iis_.valid_) return HighsStatus::kOk;
  this->iis_.invalidate();
  HighsLp& lp = model_.lp_;
  // Check for trivial IIS: empty infeasible row or inconsistent bounds
  if (this->iis_.trivial(lp, options_)) return HighsStatus::kOk;
  HighsInt num_row = lp.num_row_;
  if (num_row == 0) {
    // For an LP with no rows, the only scope for infeasibility is
    // inconsistent columns bounds - which has already been assessed,
    // so validate the empty HighsIis instance
    this->iis_.valid_ = true;
    return HighsStatus::kOk;
  }
  const bool ray_option = false;
  //      options_.iis_strategy == kIisStrategyFromRayRowPriority ||
  //      options_.iis_strategy == kIisStrategyFromRayColPriority;
  if (this->model_status_ == HighsModelStatus::kInfeasible && ray_option &&
      !ekk_instance_.status_.has_invert) {
    // Model is known to be infeasible, and a dual ray option is
    // chosen, but it has no INVERT, presumably because infeasibility
    // detected in presolve, so solve without presolve
    std::string presolve = options_.presolve;
    options_.presolve = kHighsOffString;

    HighsIisInfo iis_info;
    iis_info.simplex_time = -this->getRunTime();
    iis_info.simplex_iterations = -info_.simplex_iteration_count;
    HighsStatus run_status = this->run();
    options_.presolve = presolve;
    if (run_status != HighsStatus::kOk) return run_status;
    iis_info.simplex_time += this->getRunTime();
    iis_info.simplex_iterations += -info_.simplex_iteration_count;
    this->iis_.info_.push_back(iis_info);

    // Model should remain infeasible!
    if (this->model_status_ != HighsModelStatus::kInfeasible) {
      highsLogUser(
          options_.log_options, HighsLogType::kError,
          "Model status has switched from %s to %s when solving without "
          "presolve\n",
          this->modelStatusToString(HighsModelStatus::kInfeasible).c_str(),
          this->modelStatusToString(this->model_status_).c_str());
      return HighsStatus::kError;
    }
  }
  const bool has_dual_ray = ekk_instance_.dual_ray_record_.index != kNoRayIndex;
  if (ray_option && !has_dual_ray)
    highsLogUser(
        options_.log_options, HighsLogType::kWarning,
        "No known dual ray from which to compute IIS: using whole model\n");
  std::vector<HighsInt> infeasible_row_subset;
  if (ray_option && has_dual_ray) {
    // Compute the dual ray to identify an infeasible subset of rows
    assert(ekk_instance_.status_.has_invert);
    assert(!lp.is_moved_);
    std::vector<double> rhs;
    HighsInt iRow = ekk_instance_.dual_ray_record_.index;
    rhs.assign(num_row, 0);
    rhs[iRow] = 1;
    std::vector<double> dual_ray_value(num_row);
    HighsInt* dual_ray_num_nz = 0;
    basisSolveInterface(rhs, dual_ray_value.data(), dual_ray_num_nz, NULL,
                        true);
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      if (dual_ray_value[iRow]) infeasible_row_subset.push_back(iRow);
  } else {
    // Full LP option chosen or no dual ray to use
    //
    // Working on the whole model so clear all solver data
    this->invalidateSolverData();
    // 1789 Remove this check!
    HighsLp check_lp_before = this->model_.lp_;
    // Apply the elasticity filter to the whole model in order to
    // determine an infeasible subset of rows
    HighsStatus return_status =
        this->elasticityFilter(-1.0, -1.0, 1.0, nullptr, nullptr, nullptr, true,
                               infeasible_row_subset);
    HighsLp check_lp_after = this->model_.lp_;
    assert(check_lp_before.equalButForScalingAndNames(check_lp_after));
    if (return_status != HighsStatus::kOk) return return_status;
  }
  HighsStatus return_status = HighsStatus::kOk;
  if (infeasible_row_subset.size() == 0) {
    // No subset of infeasible rows, so model is feasible
    this->iis_.valid_ = true;
  } else {
    return_status =
        this->iis_.getData(lp, options_, basis_, infeasible_row_subset);
    if (return_status == HighsStatus::kOk) {
      // Existence of non-empty IIS => infeasibility
      if (this->iis_.col_index_.size() > 0 || this->iis_.row_index_.size() > 0)
        this->model_status_ = HighsModelStatus::kInfeasible;
    }
    // Analyse the LP solution data
    const HighsInt num_lp_solved = this->iis_.info_.size();
    double min_time = kHighsInf;
    double sum_time = 0;
    double max_time = 0;
    HighsInt min_iterations = kHighsIInf;
    HighsInt sum_iterations = 0;
    HighsInt max_iterations = 0;
    for (HighsInt iX = 0; iX < num_lp_solved; iX++) {
      double time = this->iis_.info_[iX].simplex_time;
      HighsInt iterations = this->iis_.info_[iX].simplex_iterations;
      min_time = std::min(time, min_time);
      sum_time += time;
      max_time = std::max(time, max_time);
      min_iterations = std::min(iterations, min_iterations);
      sum_iterations += iterations;
      max_iterations = std::max(iterations, max_iterations);
    }
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 " %d cols, %d rows, %d LPs solved"
                 " (min / average / max) iteration count (%6d / %6.2g / % 6d)"
                 " and time (%6.2f / %6.2f / % 6.2f) \n",
                 int(this->iis_.col_index_.size()),
                 int(this->iis_.row_index_.size()), int(num_lp_solved),
                 int(min_iterations),
                 num_lp_solved > 0 ? (1.0 * sum_iterations) / num_lp_solved : 0,
                 int(max_iterations), min_time,
                 num_lp_solved > 0 ? sum_time / num_lp_solved : 0, max_time);
  }
  return return_status;
}